

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::FindAndConsumeN(StringPiece *input,RE2 *re,Arg **args,int n)

{
  bool bVar1;
  int local_30;
  int local_2c;
  int consumed;
  int n_local;
  Arg **args_local;
  RE2 *re_local;
  StringPiece *input_local;
  
  local_2c = n;
  _consumed = args;
  args_local = (Arg **)re;
  re_local = (RE2 *)input;
  bVar1 = DoMatch(re,input,UNANCHORED,&local_30,args,n);
  if (bVar1) {
    StringPiece::remove_prefix((StringPiece *)re_local,local_30);
  }
  return bVar1;
}

Assistant:

bool RE2::FindAndConsumeN(StringPiece* input, const RE2& re,
                          const Arg* const args[], int n) {
  int consumed;
  if (re.DoMatch(*input, UNANCHORED, &consumed, args, n)) {
    input->remove_prefix(consumed);
    return true;
  } else {
    return false;
  }
}